

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O3

int ply_write_header(p_ply ply)

{
  p_ply_element ptVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  iVar2 = fprintf((FILE *)ply->fp,"ply\nformat %s 1.0\n",ply_storage_mode_list[ply->storage_mode]);
  if (iVar2 < 1) {
LAB_0038a3a3:
    ply_ferror(ply,"Error writing to file");
    uVar3 = 0;
  }
  else {
    if (0 < ply->ncomments) {
      lVar5 = 0;
      lVar6 = 0;
      do {
        iVar2 = fprintf((FILE *)ply->fp,"comment %s\n",ply->comment + lVar5);
        if (iVar2 < 1) goto LAB_0038a3a3;
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + 0x400;
      } while (lVar6 < ply->ncomments);
    }
    if (0 < ply->nobj_infos) {
      lVar5 = 0;
      lVar6 = 0;
      do {
        iVar2 = fprintf((FILE *)ply->fp,"obj_info %s\n",ply->obj_info + lVar5);
        if (iVar2 < 1) goto LAB_0038a3a3;
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + 0x400;
      } while (lVar6 < ply->nobj_infos);
    }
    if (0 < ply->nelements) {
      lVar5 = 0;
      do {
        ptVar1 = ply->element + lVar5;
        iVar2 = fprintf((FILE *)ply->fp,"element %s %ld\n",ptVar1);
        if (iVar2 < 1) goto LAB_0038a3a3;
        if (0 < ptVar1->nproperties) {
          lVar6 = 0;
          lVar7 = 0;
          do {
            uVar4 = (ulong)*(uint *)((long)&ptVar1->property->type + lVar6);
            if (uVar4 == 0x10) {
              iVar2 = fprintf((FILE *)ply->fp,"property list %s %s %s\n",
                              ply_type_list[*(uint *)((long)&ptVar1->property->length_type + lVar6)]
                             );
            }
            else {
              iVar2 = fprintf((FILE *)ply->fp,"property %s %s\n",ply_type_list[uVar4]);
            }
            if (iVar2 < 1) goto LAB_0038a3a3;
            lVar7 = lVar7 + 1;
            lVar6 = lVar6 + 0x128;
          } while (lVar7 < ptVar1->nproperties);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < ply->nelements);
    }
    iVar2 = fprintf((FILE *)ply->fp,"end_header\n");
    uVar3 = (uint)(0 < iVar2);
  }
  return uVar3;
}

Assistant:

int ply_write_header(p_ply ply) {
    long i, j;
    assert(ply && ply->fp && ply->io_mode == PLY_WRITE);
    assert(ply->element || ply->nelements == 0);
    assert(!ply->element || ply->nelements > 0);
    if (fprintf(ply->fp, "ply\nformat %s 1.0\n",
                ply_storage_mode_list[ply->storage_mode]) <= 0)
        goto error;
    for (i = 0; i < ply->ncomments; i++)
        if (fprintf(ply->fp, "comment %s\n", ply->comment + LINESIZE * i) <= 0)
            goto error;
    for (i = 0; i < ply->nobj_infos; i++)
        if (fprintf(ply->fp, "obj_info %s\n", ply->obj_info + LINESIZE * i) <=
            0)
            goto error;
    for (i = 0; i < ply->nelements; i++) {
        p_ply_element element = &ply->element[i];
        assert(element->property || element->nproperties == 0);
        assert(!element->property || element->nproperties > 0);
        if (fprintf(ply->fp, "element %s %ld\n", element->name,
                    element->ninstances) <= 0)
            goto error;
        for (j = 0; j < element->nproperties; j++) {
            p_ply_property property = &element->property[j];
            if (property->type == PLY_LIST) {
                if (fprintf(ply->fp, "property list %s %s %s\n",
                            ply_type_list[property->length_type],
                            ply_type_list[property->value_type],
                            property->name) <= 0)
                    goto error;
            } else {
                if (fprintf(ply->fp, "property %s %s\n",
                            ply_type_list[property->type], property->name) <= 0)
                    goto error;
            }
        }
    }
    return fprintf(ply->fp, "end_header\n") > 0;
error:
    ply_ferror(ply, "Error writing to file");
    return 0;
}